

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_build_lights.cxx
# Opt level: O1

void __thiscall xray_re::xr_build_lights::load(xr_build_lights *this,xr_reader *r)

{
  bool cs;
  bool bVar1;
  byte bVar2;
  size_t sVar3;
  uint32_t id;
  uint32_t find_id;
  xr_build_lights *this_00;
  byte bVar4;
  
  bVar2 = 1;
  bVar4 = 1;
  find_id = 0;
  bVar1 = true;
  cs = true;
  do {
    this_00 = (xr_build_lights *)r;
    sVar3 = xr_reader::find_chunk(r,find_id);
    if (sVar3 != 0) {
      bVar4 = bVar2;
      if (0x28f5c28f5c28f5c <
          (sVar3 * -0x70a3d70a3d70a3d7 >> 2 | sVar3 * -0x70a3d70a3d70a3d7 << 0x3e)) {
        bVar4 = 0;
      }
      cs = bVar1;
      bVar2 = bVar4;
      if (0x276276276276276 < (sVar3 * 0x4ec4ec4ec4ec4ec5 >> 3 | sVar3 * 0x4ec4ec4ec4ec4ec5 << 0x3d)
         ) {
        bVar1 = false;
        cs = false;
      }
    }
    find_id = find_id + 1;
  } while (find_id != 3);
  if ((bool)(bVar4 | cs)) {
    if ((bVar4 & cs) != 0) {
      msg("can\'t autodetect build.lights version");
      return;
    }
    read_lights(this_00,r,0,&this->m_rgb,cs);
    read_lights(this_00,r,1,&this->m_hemi,cs);
    read_lights(this_00,r,2,&this->m_sun,cs);
    return;
  }
  __assert_fail("can_be_soc || can_be_cs",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_build_lights.cxx"
                ,0x19,"void xray_re::xr_build_lights::load(xr_reader &)");
}

Assistant:

void xr_build_lights::load(xr_reader& r)
{
	bool can_be_soc = true, can_be_cs = true;
	for (uint32_t id = BL_CHUNK_RGB; id <= BL_CHUNK_SUN; ++id) {
		if (size_t size = r.find_chunk(id)) {
			if (size % R_LIGHT_SIZE_SOC)
				can_be_soc = false;
			if (size % R_LIGHT_SIZE_CS)
				can_be_cs = false;
		}
	}
	xr_assert(can_be_soc || can_be_cs);
	if (can_be_soc && can_be_cs) {
		msg("can't autodetect build.lights version");
		return;
	}
	read_lights(r, BL_CHUNK_RGB, m_rgb, can_be_cs);
	read_lights(r, BL_CHUNK_HEMI, m_hemi, can_be_cs);
	read_lights(r, BL_CHUNK_SUN, m_sun, can_be_cs);
}